

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

Var Js::TypedArrayBase::CommonSet(Arguments *args)

{
  ScriptContext *this;
  bool bVar1;
  BOOL BVar2;
  uint32 targetLength;
  Var pvVar3;
  JavascriptLibrary *this_00;
  RecyclableObject *pRVar4;
  TypedArrayBase *local_48;
  RecyclableObject *local_40;
  RecyclableObject *sourceArray;
  TypedArrayBase *typedArraySource;
  ScriptContext *pSStack_28;
  uint32 offset;
  ScriptContext *scriptContext;
  TypedArrayBase *typedArrayBase;
  Arguments *args_local;
  
  typedArrayBase = (TypedArrayBase *)args;
  pvVar3 = Arguments::operator[](args,0);
  scriptContext = (ScriptContext *)VarTo<Js::TypedArrayBase>(pvVar3);
  pSStack_28 = RecyclableObject::GetScriptContext((RecyclableObject *)scriptContext);
  typedArraySource._4_4_ = 0;
  if (((uint)(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
             super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
             _vptr_IRecyclerVisitedObject & 0xffffff) < 2) {
    JavascriptError::ThrowTypeError(pSStack_28,-0x7ff5ec22,(PCWSTR)0x0);
  }
  if (2 < ((uint)(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                 super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject & 0xffffff)) {
    pvVar3 = Arguments::operator[]((Arguments *)typedArrayBase,2);
    typedArraySource._4_4_ = ArrayBuffer::ToIndex(pvVar3,-0x7ff5ec24,pSStack_28,0x7fffffff,false);
  }
  args_local = (Arguments *)Arguments::operator[]((Arguments *)typedArrayBase,1);
  bVar1 = VarIs<Js::TypedArrayBase>(args_local);
  if (bVar1) {
    local_48 = UnsafeVarTo<Js::TypedArrayBase>(args_local);
  }
  else {
    local_48 = (TypedArrayBase *)0x0;
  }
  sourceArray = (RecyclableObject *)local_48;
  if (local_48 != (TypedArrayBase *)0x0) {
    bVar1 = IsDetachedBuffer(local_48);
    if (!bVar1) {
      bVar1 = IsDetachedBuffer((TypedArrayBase *)scriptContext);
      if (!bVar1) {
        Set((TypedArrayBase *)scriptContext,(TypedArrayBase *)sourceArray,typedArraySource._4_4_);
        goto LAB_0138dc10;
      }
    }
    JavascriptError::ThrowTypeError(pSStack_28,-0x7ff5ebe5,L"[TypedArray].prototype.set");
  }
  pvVar3 = Arguments::operator[]((Arguments *)typedArrayBase,1);
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(pvVar3);
  pvVar3 = Arguments::operator[]((Arguments *)typedArrayBase,1);
  BVar2 = JavascriptConversion::ToObject(pvVar3,pSStack_28,&local_40);
  if (BVar2 == 0) {
    JavascriptError::ThrowTypeError(pSStack_28,-0x7ff5ec22,(PCWSTR)0x0);
  }
  bVar1 = IsDetachedBuffer((TypedArrayBase *)scriptContext);
  this = scriptContext;
  if (bVar1) {
    JavascriptError::ThrowTypeError(pSStack_28,-0x7ff5ebe5,L"[TypedArray].prototype.set");
  }
  targetLength = ArrayObject::GetLength((ArrayObject *)scriptContext);
  SetObject((TypedArrayBase *)this,local_40,targetLength,typedArraySource._4_4_);
LAB_0138dc10:
  this_00 = ScriptContext::GetLibrary(pSStack_28);
  pRVar4 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
  return pRVar4;
}

Assistant:

Var TypedArrayBase::CommonSet(Arguments& args)
    {
        TypedArrayBase* typedArrayBase = VarTo<TypedArrayBase>(args[0]);
        ScriptContext* scriptContext = typedArrayBase->GetScriptContext();
        uint32 offset = 0;
        if (args.Info.Count < 2)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_TypedArray_NeedSource);
        }

        if (args.Info.Count > 2)
        {
            offset = ArrayBuffer::ToIndex(args[2], JSERR_InvalidTypedArrayLength, scriptContext, ArrayBuffer::MaxArrayBufferLength, false);
        }

        TypedArrayBase* typedArraySource = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(args[1]);
        if (typedArraySource)
        {
            if (typedArraySource->IsDetachedBuffer() || typedArrayBase->IsDetachedBuffer()) // If IsDetachedBuffer(targetBuffer) is true, then throw a TypeError exception.
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, _u("[TypedArray].prototype.set"));
            }
            typedArrayBase->Set(typedArraySource, (uint32)offset);
        }
        else
        {
            RecyclableObject* sourceArray;
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(args[1]);
#endif
            if (!JavascriptConversion::ToObject(args[1], scriptContext, &sourceArray))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_TypedArray_NeedSource);
            }
            else if (typedArrayBase->IsDetachedBuffer())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, _u("[TypedArray].prototype.set"));
            }
            typedArrayBase->SetObject(sourceArray, typedArrayBase->GetLength(), (uint32)offset);
        }
        return scriptContext->GetLibrary()->GetUndefined();
    }